

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_reflection_setters
          (t_java_generator *this,ostringstream *out,t_type *type,string *field_name,
          string *cap_name)

{
  int iVar1;
  ostream *poVar2;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_78;
  string local_58;
  byte local_31;
  string *psStack_30;
  bool is_binary;
  string *cap_name_local;
  string *field_name_local;
  t_type *type_local;
  ostringstream *out_local;
  t_java_generator *this_local;
  
  psStack_30 = cap_name;
  cap_name_local = field_name;
  field_name_local = (string *)type;
  type_local = (t_type *)out;
  out_local = (ostringstream *)this;
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[7])();
  local_31 = (byte)iVar1;
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
  poVar2 = std::operator<<(poVar2,"case ");
  std::__cxx11::string::string((string *)&local_78,(string *)field_name);
  constant_name(&local_58,this,&local_78);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  poVar2 = std::operator<<(poVar2,":");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  t_generator::indent_up((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
  poVar2 = std::operator<<(poVar2,"if (value == null) {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
  poVar2 = std::operator<<(poVar2,"  unset");
  std::__cxx11::string::string((string *)&local_c8,(string *)field_name);
  get_cap_name(&local_a8,this,&local_c8);
  poVar2 = std::operator<<(poVar2,(string *)&local_a8);
  poVar2 = std::operator<<(poVar2,"();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
  poVar2 = std::operator<<(poVar2,"} else {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if ((local_31 & 1) != 0) {
    t_generator::indent_up((t_generator *)this);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
    poVar2 = std::operator<<(poVar2,"if (value instanceof byte[]) {");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
    poVar2 = std::operator<<(poVar2,"  set");
    poVar2 = std::operator<<(poVar2,(string *)cap_name);
    poVar2 = std::operator<<(poVar2,"((byte[])value);");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
    poVar2 = std::operator<<(poVar2,"} else {");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
  poVar2 = std::operator<<(poVar2,"  set");
  poVar2 = std::operator<<(poVar2,(string *)cap_name);
  poVar2 = std::operator<<(poVar2,"((");
  type_name_abi_cxx11_(&local_e8,this,(t_type *)field_name_local,true,false,false,false);
  poVar2 = std::operator<<(poVar2,(string *)&local_e8);
  poVar2 = std::operator<<(poVar2,")value);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e8);
  if ((local_31 & 1) != 0) {
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
  }
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
  poVar2 = std::operator<<(poVar2,"break;");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  return;
}

Assistant:

void t_java_generator::generate_reflection_setters(ostringstream& out,
                                                   t_type* type,
                                                   string field_name,
                                                   string cap_name) {
  const bool is_binary = type->is_binary();
  indent(out) << "case " << constant_name(field_name) << ":" << endl;
  indent_up();
  indent(out) << "if (value == null) {" << endl;
  indent(out) << "  unset" << get_cap_name(field_name) << "();" << endl;
  indent(out) << "} else {" << endl;
  if (is_binary) {
    indent_up();
    indent(out) << "if (value instanceof byte[]) {" << endl;
    indent(out) << "  set" << cap_name << "((byte[])value);" << endl;
    indent(out) << "} else {" << endl;
  }
  indent(out) << "  set" << cap_name << "((" << type_name(type, true, false) << ")value);" << endl;
  if (is_binary) {
    indent(out) << "}" << endl;
    indent_down();
  }
  indent(out) << "}" << endl;
  indent(out) << "break;" << endl << endl;

  indent_down();
}